

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfQueue.c
# Opt level: O3

sbfQueueItem sbfQueue_getItem(sbfQueue queue,sbfQueueCb cb,void *closure)

{
  u_int *puVar1;
  sbfSpinLock *__lock;
  sbfPool psVar2;
  sbfPoolItemImpl *psVar3;
  
  psVar2 = queue->mPool;
  LOCK();
  puVar1 = &psVar2->mCount->mGets;
  *puVar1 = *puVar1 + 1;
  UNLOCK();
  __lock = &psVar2->mLock;
  pthread_spin_lock(__lock);
  psVar3 = psVar2->mAvailable;
  if (psVar3 == (sbfPoolItemImpl *)0x0) {
    LOCK();
    psVar3 = psVar2->mFree;
    psVar2->mFree = (sbfPoolItemImpl *)0x0;
    UNLOCK();
    if (psVar3 == (sbfPoolItemImpl *)0x0) {
      pthread_spin_unlock(__lock);
      LOCK();
      puVar1 = &psVar2->mCount->mNews;
      *puVar1 = *puVar1 + 1;
      UNLOCK();
      psVar3 = (sbfPoolItemImpl *)sbfMemory_malloc(psVar2->mSize);
      psVar3->mPool = psVar2;
      psVar3->mNext = (sbfPoolItemImpl *)0x0;
      goto LAB_00103614;
    }
  }
  psVar2->mAvailable = psVar3->mNext;
  pthread_spin_unlock(__lock);
LAB_00103614:
  psVar3[1].mPool = (sbfPool)cb;
  psVar3[1].mNext = (sbfPoolItemImpl *)closure;
  return (sbfQueueItem)(psVar3 + 1);
}

Assistant:

sbfQueueItem
sbfQueue_getItem (sbfQueue queue, sbfQueueCb cb, void* closure)
{
    sbfQueueItem item;

    item = sbfPool_get (queue->mPool);
    item->mCb = cb;
    item->mClosure = closure;
    return item;
}